

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc_cord_state.cc
# Opt level: O1

RefcountedRep * absl::lts_20250127::crc_internal::CrcCordState::RefSharedEmptyRep(void)

{
  int iVar1;
  
  if (RefSharedEmptyRep()::empty == '\0') {
    iVar1 = __cxa_guard_acquire(&RefSharedEmptyRep()::empty);
    if (iVar1 != 0) {
      RefSharedEmptyRep::empty.impl_.space_[0] = '\x01';
      RefSharedEmptyRep::empty.impl_.space_[1] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[2] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[3] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[4] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[5] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[6] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[7] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[8] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[9] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[10] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0xb] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0xc] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0xd] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0xe] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0xf] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x10] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x11] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x12] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x13] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x14] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x15] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x16] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x17] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x18] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x19] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x1a] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x1b] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x1c] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x1d] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x1e] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x1f] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x20] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x21] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x22] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x23] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x24] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x25] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x26] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x27] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x28] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x29] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x2a] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x2b] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x2c] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x2d] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x2e] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x2f] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x30] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x31] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x32] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x33] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x34] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x35] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x36] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x37] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x38] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x39] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x3a] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x3b] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x3c] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x3d] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x3e] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x3f] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x40] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x41] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x42] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x43] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x44] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x45] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x46] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x47] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x48] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x49] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x4a] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x4b] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x4c] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x4d] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x4e] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x4f] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x50] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x51] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x52] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x53] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x54] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x55] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x56] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x57] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x58] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x59] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x5a] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x5b] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x5c] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x5d] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x5e] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x5f] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x60] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x61] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x62] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[99] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[100] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x65] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x66] = '\0';
      RefSharedEmptyRep::empty.impl_.space_[0x67] = '\0';
      std::
      _Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
      ::_M_initialize_map((_Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
                           *)(RefSharedEmptyRep::empty.impl_.space_ + 0x18),0);
      __cxa_guard_release(&RefSharedEmptyRep()::empty);
    }
  }
  if ((int)RefSharedEmptyRep::empty.impl_.space_._0_4_ < 1) {
    __assert_fail("empty->count.load(std::memory_order_relaxed) >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/crc/internal/crc_cord_state.cc"
                  ,0x1e,
                  "static CrcCordState::RefcountedRep *absl::crc_internal::CrcCordState::RefSharedEmptyRep()"
                 );
  }
  if (RefSharedEmptyRep::empty.impl_.space_._8_8_ != 0) {
    __assert_fail("empty->rep.removed_prefix.length == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/crc/internal/crc_cord_state.cc"
                  ,0x1f,
                  "static CrcCordState::RefcountedRep *absl::crc_internal::CrcCordState::RefSharedEmptyRep()"
                 );
  }
  if (RefSharedEmptyRep::empty.impl_.space_._72_8_ == RefSharedEmptyRep::empty.impl_.space_._40_8_)
  {
    LOCK();
    RefSharedEmptyRep::empty.impl_.space_._0_4_ = RefSharedEmptyRep::empty.impl_.space_._0_4_ + 1;
    UNLOCK();
    return (RefcountedRep *)&RefSharedEmptyRep::empty;
  }
  __assert_fail("empty->rep.prefix_crc.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/crc/internal/crc_cord_state.cc"
                ,0x20,
                "static CrcCordState::RefcountedRep *absl::crc_internal::CrcCordState::RefSharedEmptyRep()"
               );
}

Assistant:

CrcCordState::RefcountedRep* CrcCordState::RefSharedEmptyRep() {
  static absl::NoDestructor<CrcCordState::RefcountedRep> empty;

  assert(empty->count.load(std::memory_order_relaxed) >= 1);
  assert(empty->rep.removed_prefix.length == 0);
  assert(empty->rep.prefix_crc.empty());

  Ref(empty.get());
  return empty.get();
}